

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O0

void __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::Matching(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
           *this,Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *graph,
          vector<double,_std::allocator<double>_> *costs,vector<int,_std::allocator<int>_> *mask)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  size_t sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  bool in_stack_00000017;
  size_type in_stack_00000018;
  vector<bool,_std::allocator<bool>_> *in_stack_00000020;
  size_t v;
  size_t in_stack_ffffffffffffff78;
  Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_ffffffffffffff80;
  unsigned_long *in_stack_ffffffffffffff88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_28;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  in_RDI[2] = in_RCX;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1cd463);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1cd476);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x1cd489);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x1cd49c);
  std::
  vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
  ::vector((vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
            *)0x1cd4b2);
  *(undefined4 *)(in_RDI + 0x17) = 0;
  local_28 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  while (this_00 = local_28,
        pvVar1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
                 numberOfVertices((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                                  0x1cd4e1), this_00 < pvVar1) {
    sVar2 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
            numberOfEdgesToVertex(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (sVar2 == 0) {
      sVar2 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
              numberOfEdgesFromVertex(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      if (sVar2 != 0) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                  (this_00,in_stack_ffffffffffffff88);
      }
    }
    else {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                (this_00,in_stack_ffffffffffffff88);
    }
    local_28 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(local_28->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 3));
  std::vector<bool,_std::allocator<bool>_>::resize
            (in_stack_00000020,in_stack_00000018,in_stack_00000017);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 6));
  std::vector<bool,_std::allocator<bool>_>::resize
            (in_stack_00000020,in_stack_00000018,in_stack_00000017);
  return;
}

Assistant:

Matching(GRAPH const& graph, COST& costs, MASK& mask)
      : graph_(graph)
      , costs_(costs)
      , mask_(mask)
    {
        for (size_t v = 0; v < graph_.numberOfVertices(); ++v) {
            if (graph_.numberOfEdgesToVertex(v) > 0)
                cols_.emplace_back(v);
            else if (graph_.numberOfEdgesFromVertex(v) > 0)
                rows_.emplace_back(v);
        }

        row_cover.resize(rows_.size(), false);
        col_cover.resize(cols_.size(), false);
    }